

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-apply.cc
# Opt level: O0

bool tinyusdz::tydra::ApplyToXformable
               (Stage *stage,Prim *prim,
               function<bool_(const_tinyusdz::Stage_&,_const_tinyusdz::Xformable_*)> *fn)

{
  GPrim *__args_1;
  Xformable *__args_1_00;
  GeomMesh *__args_1_01;
  GeomSphere *__args_1_02;
  GeomCapsule *__args_1_03;
  GeomCube *__args_1_04;
  GeomPoints *__args_1_05;
  GeomCylinder *__args_1_06;
  GeomBasisCurves *__args_1_07;
  SkelRoot *__args_1_08;
  SkelRoot *v_9;
  GeomBasisCurves *v_8;
  GeomCylinder *v_7;
  GeomPoints *v_6;
  GeomCube *v_5;
  GeomCapsule *v_4;
  GeomSphere *v_3;
  GeomMesh *v_2;
  Xform *v_1;
  GPrim *v;
  function<bool_(const_tinyusdz::Stage_&,_const_tinyusdz::Xformable_*)> *fn_local;
  Prim *prim_local;
  Stage *stage_local;
  
  __args_1 = Prim::as<tinyusdz::GPrim>(prim);
  if (__args_1 == (GPrim *)0x0) {
    __args_1_00 = (Xformable *)Prim::as<tinyusdz::Xform>(prim);
    if (__args_1_00 == (Xformable *)0x0) {
      __args_1_01 = Prim::as<tinyusdz::GeomMesh>(prim);
      if (__args_1_01 == (GeomMesh *)0x0) {
        __args_1_02 = Prim::as<tinyusdz::GeomSphere>(prim);
        if (__args_1_02 == (GeomSphere *)0x0) {
          __args_1_03 = Prim::as<tinyusdz::GeomCapsule>(prim);
          if (__args_1_03 == (GeomCapsule *)0x0) {
            __args_1_04 = Prim::as<tinyusdz::GeomCube>(prim);
            if (__args_1_04 == (GeomCube *)0x0) {
              __args_1_05 = Prim::as<tinyusdz::GeomPoints>(prim);
              if (__args_1_05 == (GeomPoints *)0x0) {
                __args_1_06 = Prim::as<tinyusdz::GeomCylinder>(prim);
                if (__args_1_06 == (GeomCylinder *)0x0) {
                  __args_1_07 = Prim::as<tinyusdz::GeomBasisCurves>(prim);
                  if (__args_1_07 == (GeomBasisCurves *)0x0) {
                    __args_1_08 = Prim::as<tinyusdz::SkelRoot>(prim);
                    if (__args_1_08 == (SkelRoot *)0x0) {
                      stage_local._7_1_ = false;
                    }
                    else {
                      stage_local._7_1_ =
                           ::std::
                           function<bool_(const_tinyusdz::Stage_&,_const_tinyusdz::Xformable_*)>::
                           operator()(fn,stage,&__args_1_08->super_Xformable);
                    }
                  }
                  else {
                    stage_local._7_1_ =
                         ::std::
                         function<bool_(const_tinyusdz::Stage_&,_const_tinyusdz::Xformable_*)>::
                         operator()(fn,stage,(Xformable *)__args_1_07);
                  }
                }
                else {
                  stage_local._7_1_ =
                       ::std::function<bool_(const_tinyusdz::Stage_&,_const_tinyusdz::Xformable_*)>
                       ::operator()(fn,stage,(Xformable *)__args_1_06);
                }
              }
              else {
                stage_local._7_1_ =
                     ::std::function<bool_(const_tinyusdz::Stage_&,_const_tinyusdz::Xformable_*)>::
                     operator()(fn,stage,(Xformable *)__args_1_05);
              }
            }
            else {
              stage_local._7_1_ =
                   ::std::function<bool_(const_tinyusdz::Stage_&,_const_tinyusdz::Xformable_*)>::
                   operator()(fn,stage,(Xformable *)__args_1_04);
            }
          }
          else {
            stage_local._7_1_ =
                 ::std::function<bool_(const_tinyusdz::Stage_&,_const_tinyusdz::Xformable_*)>::
                 operator()(fn,stage,(Xformable *)__args_1_03);
          }
        }
        else {
          stage_local._7_1_ =
               ::std::function<bool_(const_tinyusdz::Stage_&,_const_tinyusdz::Xformable_*)>::
               operator()(fn,stage,(Xformable *)__args_1_02);
        }
      }
      else {
        stage_local._7_1_ =
             ::std::function<bool_(const_tinyusdz::Stage_&,_const_tinyusdz::Xformable_*)>::
             operator()(fn,stage,(Xformable *)__args_1_01);
      }
    }
    else {
      stage_local._7_1_ =
           ::std::function<bool_(const_tinyusdz::Stage_&,_const_tinyusdz::Xformable_*)>::operator()
                     (fn,stage,__args_1_00);
    }
  }
  else {
    stage_local._7_1_ =
         ::std::function<bool_(const_tinyusdz::Stage_&,_const_tinyusdz::Xformable_*)>::operator()
                   (fn,stage,&__args_1->super_Xformable);
  }
  return stage_local._7_1_;
}

Assistant:

bool ApplyToXformable(
  const Stage &stage, const Prim &prim,
  std::function<bool(const Stage &stage, const Xformable *xformable)> fn) {

  (void)stage;

#define APPLY_FUN(__ty) { \
  const auto *v = prim.as<__ty>(); \
  if (v) { \
    return fn(stage, v); \
  } \
  }

  APPLY_FUN(GPrim)
  APPLY_FUN(Xform)
  APPLY_FUN(GeomMesh)
  APPLY_FUN(GeomSphere)
  APPLY_FUN(GeomCapsule)
  APPLY_FUN(GeomCube)
  APPLY_FUN(GeomPoints)
  APPLY_FUN(GeomCylinder)
  APPLY_FUN(GeomBasisCurves)
  APPLY_FUN(SkelRoot)

#undef APPLY_FUN

  return false;

}